

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_replace(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_replaceAll)

{
  JSValue *pJVar1;
  int64_t iVar2;
  JSValue val;
  JSValue func_obj;
  bool bVar3;
  int iVar4;
  uint uVar5;
  JSValueUnion JVar6;
  JSValueUnion JVar7;
  JSValueUnion JVar8;
  ulong uVar9;
  JSValueUnion JVar10;
  JSValueUnion JVar11;
  uint32_t from;
  JSValueUnion JVar12;
  JSValue JVar13;
  JSValue JVar14;
  JSValue JVar15;
  JSValue JVar16;
  JSValue JVar17;
  int64_t local_f0;
  JSValueUnion local_d8;
  StringBuffer local_b8;
  JSValueUnion local_98;
  int64_t local_90;
  JSValueUnion local_88;
  int64_t local_80;
  JSValueUnion local_78;
  int64_t local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  JVar10._4_4_ = 0;
  JVar10.int32 = argc;
  JVar11 = this_val.u;
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeError(ctx,"cannot convert to object");
  }
  else {
    JVar6 = argv->u;
    JVar17 = *argv;
    JVar16 = *argv;
    JVar15 = *argv;
    JVar14 = *argv;
    pJVar1 = argv + 1;
    JVar7 = pJVar1->u;
    iVar2 = argv[1].tag;
    func_obj = *pJVar1;
    val = *pJVar1;
    JVar13 = *pJVar1;
    if (((uint)argv->tag & 0xfffffffe) != 2) {
      if ((is_replaceAll != 0) && (iVar4 = check_regexp_g_flag(ctx,*argv), iVar4 < 0)) {
LAB_0015902c:
        return (JSValue)(ZEXT816(6) << 0x40);
      }
      JVar14 = JS_GetPropertyInternal(ctx,JVar14,0xc9,JVar15,0);
      JVar10.int32 = (int)JVar14.tag - 2;
      JVar10._4_4_ = 0;
      argv = (JSValue *)JVar6;
      if (1 < (uint)JVar10.int32) {
        if ((int)JVar14.tag != 6) {
          local_98 = JVar11;
          local_90 = this_val.tag;
          local_88 = JVar7;
          local_80 = iVar2;
          JVar14 = JS_CallFree(ctx,JVar14,JVar17,2,(JSValue *)&local_98);
          return JVar14;
        }
        goto LAB_0015902c;
      }
    }
    string_buffer_init(ctx,&local_b8,0);
    JVar15 = JS_ToString(ctx,this_val);
    JVar6 = JVar15.u;
    JVar14 = (JSValue)(ZEXT816(3) << 0x40);
    if ((int)JVar15.tag == 6) {
      JVar16 = (JSValue)(ZEXT816(3) << 0x40);
      JVar14 = (JSValue)(ZEXT816(3) << 0x40);
    }
    else {
      JVar16 = JS_ToString(ctx,JVar16);
      JVar7 = JVar16.u;
      if ((int)JVar16.tag != 6) {
        iVar4 = JS_IsFunction(ctx,JVar13);
        from = 0;
        JVar14 = (JSValue)(ZEXT816(3) << 0x40);
        if (iVar4 != 0) {
LAB_0015909a:
          JVar8.ptr = (void *)((ulong)JVar14.u.ptr & 0xffffffff | (long)JVar10.ptr << 0x20);
          uVar9 = *(ulong *)((long)JVar7.ptr + 4);
          bVar3 = false;
          do {
            local_f0 = JVar14.tag;
            if ((uVar9 & 0x7fffffff) == 0) {
              JVar12.float64 = 0.0;
              if (bVar3) {
                if ((*(uint *)((long)JVar6.ptr + 4) & 0x7fffffff) <= from) break;
                JVar12._4_4_ = 0;
                JVar12.int32 = from + 1;
              }
            }
            else {
              uVar5 = string_indexof((JSString *)JVar6.ptr,(JSString *)JVar7.ptr,from);
              JVar12._4_4_ = 0;
              JVar12.int32 = uVar5;
              if ((int)uVar5 < 0) {
                if (!bVar3) {
                  (*((local_b8.ctx)->rt->mf).js_free)
                            (&(local_b8.ctx)->rt->malloc_state,local_b8.str);
                  JS_FreeValue(ctx,JVar16);
                  JVar14.tag = local_f0;
                  JVar14.u.ptr = JVar8.ptr;
                  JS_FreeValue(ctx,JVar14);
                  return JVar15;
                }
                break;
              }
            }
            _local_98 = JVar16;
            if (iVar4 == 0) {
              local_70 = 0;
              local_68 = 0;
              local_60 = 3;
              local_58 = 0;
              local_50 = 3;
              local_40 = local_f0;
              JVar17.tag = iVar2;
              JVar17.u.ptr = &local_98;
              local_78 = JVar12;
              local_48.ptr = JVar8.ptr;
              _local_88 = JVar15;
              JVar17 = js_string___GetSubstitution(ctx,JVar17,(int)JVar15.tag,argv);
            }
            else {
              local_80 = 0;
              argv = (JSValue *)0x3;
              local_88 = JVar12;
              _local_78 = JVar15;
              JVar17 = JS_Call(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),3,(JSValue *)&local_98);
              JVar17 = JS_ToStringFree(ctx,JVar17);
            }
            JVar11 = JVar10;
            if ((int)JVar17.tag == 6) goto LAB_00159317;
            string_buffer_concat(&local_b8,(JSString *)JVar6.ptr,from,JVar12.int32);
            string_buffer_concat_value_free(&local_b8,JVar17);
            uVar9 = *(ulong *)((long)JVar7.ptr + 4);
            from = ((uint)uVar9 & 0x7fffffff) + JVar12.int32;
            bVar3 = true;
          } while (is_replaceAll != 0);
          string_buffer_concat
                    (&local_b8,(JSString *)JVar6.ptr,from,
                     *(uint *)((long)JVar6.ptr + 4) & 0x7fffffff);
          JS_FreeValue(ctx,JVar16);
          JVar16.tag = local_f0;
          JVar16.u.ptr = JVar8.ptr;
          JS_FreeValue(ctx,JVar16);
          JS_FreeValue(ctx,JVar15);
          JVar14 = string_buffer_end(&local_b8);
          return JVar14;
        }
        JVar14 = JS_ToString(ctx,val);
        JVar10.float64 = JVar14.u.float64 >> 0x20;
        JVar11.ptr = JVar10.ptr;
        if ((int)JVar14.tag != 6) goto LAB_0015909a;
      }
    }
LAB_00159317:
    local_d8 = JVar14.u;
    (*((local_b8.ctx)->rt->mf).js_free)(&(local_b8.ctx)->rt->malloc_state,local_b8.str);
    JS_FreeValue(ctx,JVar16);
    JVar13.u.ptr = (void *)((ulong)local_d8.ptr & 0xffffffff | (long)JVar11.ptr << 0x20);
    JVar13.tag = JVar14.tag;
    JS_FreeValue(ctx,JVar13);
    JS_FreeValue(ctx,JVar15);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_string_replace(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv,
                                 int is_replaceAll)
{
    // replace(rx, rep)
    JSValueConst O = this_val, searchValue = argv[0], replaceValue = argv[1];
    JSValueConst args[6];
    JSValue str, search_str, replaceValue_str, repl_str;
    JSString *sp, *searchp;
    StringBuffer b_s, *b = &b_s;
    int pos, functionalReplace, endOfLastMatch;
    BOOL is_first;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    search_str = JS_UNDEFINED;
    replaceValue_str = JS_UNDEFINED;
    repl_str = JS_UNDEFINED;

    if (!JS_IsUndefined(searchValue) && !JS_IsNull(searchValue)) {
        JSValue replacer;
        if (is_replaceAll) {
            if (check_regexp_g_flag(ctx, searchValue) < 0)
                return JS_EXCEPTION;
        }
        replacer = JS_GetProperty(ctx, searchValue, JS_ATOM_Symbol_replace);
        if (JS_IsException(replacer))
            return JS_EXCEPTION;
        if (!JS_IsUndefined(replacer) && !JS_IsNull(replacer)) {
            args[0] = O;
            args[1] = replaceValue;
            return JS_CallFree(ctx, replacer, searchValue, 2, args);
        }
    }
    string_buffer_init(ctx, b, 0);

    str = JS_ToString(ctx, O);
    if (JS_IsException(str))
        goto exception;
    search_str = JS_ToString(ctx, searchValue);
    if (JS_IsException(search_str))
        goto exception;
    functionalReplace = JS_IsFunction(ctx, replaceValue);
    if (!functionalReplace) {
        replaceValue_str = JS_ToString(ctx, replaceValue);
        if (JS_IsException(replaceValue_str))
            goto exception;
    }

    sp = JS_VALUE_GET_STRING(str);
    searchp = JS_VALUE_GET_STRING(search_str);
    endOfLastMatch = 0;
    is_first = TRUE;
    for(;;) {
        if (unlikely(searchp->len == 0)) {
            if (is_first)
                pos = 0;
            else if (endOfLastMatch >= sp->len)
                pos = -1;
            else
                pos = endOfLastMatch + 1;
        } else {
            pos = string_indexof(sp, searchp, endOfLastMatch);
        }
        if (pos < 0) {
            if (is_first) {
                string_buffer_free(b);
                JS_FreeValue(ctx, search_str);
                JS_FreeValue(ctx, replaceValue_str);
                return str;
            } else {
                break;
            }
        }
        if (functionalReplace) {
            args[0] = search_str;
            args[1] = JS_NewInt32(ctx, pos);
            args[2] = str;
            repl_str = JS_ToStringFree(ctx, JS_Call(ctx, replaceValue, JS_UNDEFINED, 3, args));
        } else {
            args[0] = search_str;
            args[1] = str;
            args[2] = JS_NewInt32(ctx, pos);
            args[3] = JS_UNDEFINED;
            args[4] = JS_UNDEFINED;
            args[5] = replaceValue_str;
            repl_str = js_string___GetSubstitution(ctx, JS_UNDEFINED, 6, args);
        }
        if (JS_IsException(repl_str))
            goto exception;
        
        string_buffer_concat(b, sp, endOfLastMatch, pos);
        string_buffer_concat_value_free(b, repl_str);
        endOfLastMatch = pos + searchp->len;
        is_first = FALSE;
        if (!is_replaceAll)
            break;
    }
    string_buffer_concat(b, sp, endOfLastMatch, sp->len);
    JS_FreeValue(ctx, search_str);
    JS_FreeValue(ctx, replaceValue_str);
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

exception:
    string_buffer_free(b);
    JS_FreeValue(ctx, search_str);
    JS_FreeValue(ctx, replaceValue_str);
    JS_FreeValue(ctx, str);
    return JS_EXCEPTION;
}